

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall maths::Matrix::gaussianEliminate(Matrix *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  double *pdVar9;
  double **extraout_RDX;
  double **extraout_RDX_00;
  double **extraout_RDX_01;
  double **extraout_RDX_02;
  double **ppdVar10;
  double **extraout_RDX_03;
  double **extraout_RDX_04;
  Matrix *in_RDI;
  Matrix MVar11;
  int s;
  int t;
  double cur_abs;
  int k;
  double max_val;
  int max_row;
  bool pivot_found;
  int j;
  int i;
  int Acols;
  int cols;
  int rows;
  Matrix *Ab;
  Matrix *in_stack_ffffffffffffff08;
  Matrix *in_stack_ffffffffffffff10;
  double local_98;
  int local_60;
  int local_5c;
  int local_4c;
  double local_48;
  int local_40;
  int local_28;
  int local_24;
  
  Matrix(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar5 = in_RDI->rows_;
  iVar6 = in_RDI->cols_;
  local_28 = 0;
  ppdVar10 = extraout_RDX;
  for (local_24 = 0; local_24 < iVar5; local_24 = local_24 + 1) {
    bVar8 = false;
    while( true ) {
      bVar7 = false;
      if (local_28 < iVar6 + -1) {
        bVar7 = (bool)(bVar8 ^ 1);
      }
      if (!bVar7) break;
      pdVar9 = operator()(in_RDI,local_24,local_28);
      ppdVar10 = extraout_RDX_00;
      if ((*pdVar9 != 0.0) || (NAN(*pdVar9))) {
        bVar8 = true;
      }
      else {
        local_40 = local_24;
        local_48 = 0.0;
        local_4c = local_24;
        while (local_4c = local_4c + 1, local_4c < iVar5) {
          pdVar9 = operator()(in_RDI,local_4c,local_28);
          if (*pdVar9 < 0.0) {
            pdVar9 = operator()(in_RDI,local_4c,local_28);
            local_98 = *pdVar9 * -1.0;
            ppdVar10 = extraout_RDX_02;
          }
          else {
            pdVar9 = operator()(in_RDI,local_4c,local_28);
            local_98 = *pdVar9;
            ppdVar10 = extraout_RDX_01;
          }
          if (local_48 < local_98) {
            local_40 = local_4c;
            local_48 = local_98;
          }
        }
        if (local_40 == local_24) {
          local_28 = local_28 + 1;
        }
        else {
          swapRows(in_RDI,local_40,local_24);
          bVar8 = true;
          ppdVar10 = extraout_RDX_03;
        }
      }
    }
    local_5c = local_24;
    if (bVar8) {
      while (local_5c = local_5c + 1, local_60 = local_28, local_5c < iVar5) {
        while (local_60 = local_60 + 1, local_60 < iVar6) {
          pdVar9 = operator()(in_RDI,local_5c,local_60);
          dVar1 = *pdVar9;
          pdVar9 = operator()(in_RDI,local_24,local_60);
          dVar2 = *pdVar9;
          pdVar9 = operator()(in_RDI,local_5c,local_28);
          dVar3 = *pdVar9;
          pdVar9 = operator()(in_RDI,local_24,local_28);
          dVar4 = *pdVar9;
          pdVar9 = operator()(in_RDI,local_5c,local_60);
          *pdVar9 = dVar1 - dVar2 * (dVar3 / dVar4);
          pdVar9 = operator()(in_RDI,local_5c,local_60);
          if ((*pdVar9 <= 1e-10 && *pdVar9 != 1e-10) &&
             (pdVar9 = operator()(in_RDI,local_5c,local_60), -1e-10 < *pdVar9)) {
            pdVar9 = operator()(in_RDI,local_5c,local_60);
            *pdVar9 = 0.0;
          }
        }
        pdVar9 = operator()(in_RDI,local_5c,local_28);
        *pdVar9 = 0.0;
        ppdVar10 = extraout_RDX_04;
      }
    }
    local_28 = local_28 + 1;
  }
  MVar11.p = ppdVar10;
  MVar11._0_8_ = in_RDI;
  return MVar11;
}

Assistant:

Matrix Matrix::gaussianEliminate()
{
    Matrix Ab(*this);
    int rows = Ab.rows_;
    int cols = Ab.cols_;
    int Acols = cols - 1;

    int i = 0; // row tracker
    int j = 0; // column tracker

    // iterate through the rows
    while (i < rows)
    {
        // find a pivot for the row
        bool pivot_found = false;
        while (j < Acols && !pivot_found)
        {
            if (Ab(i, j) != 0) { // pivot not equal to 0
                pivot_found = true;
            } else { // check for a possible swap
                int max_row = i;
                double max_val = 0;
                for (int k = i + 1; k < rows; ++k)
                {
                    double cur_abs = Ab(k, j) >= 0 ? Ab(k, j) : -1 * Ab(k, j);
                    if (cur_abs > max_val)
                    {
                        max_row = k;
                        max_val = cur_abs;
                    }
                }
                if (max_row != i) {
                    Ab.swapRows(max_row, i);
                    pivot_found = true;
                } else {
                    j++;
                }
            }
        }

        // perform elimination as normal if pivot was found
        if (pivot_found)
        {
            for (int t = i + 1; t < rows; ++t) {
                for (int s = j + 1; s < cols; ++s) {
                    Ab(t, s) = Ab(t, s) - Ab(i, s) * (Ab(t, j) / Ab(i, j));
                    if (Ab(t, s) < EPS && Ab(t, s) > -1*EPS)
                        Ab(t, s) = 0;
                }
                Ab(t, j) = 0;
            }
        }

        i++;
        j++;
    }

    return Ab;
}